

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_formatting.cpp
# Opt level: O3

void test_manip<wchar_t>(string e_charset)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  long lVar3;
  _Alloc_hider _Var4;
  char *__format;
  int iVar5;
  ulong uVar6;
  ostream *poVar7;
  wistream *pwVar8;
  long *plVar9;
  string *psVar10;
  time_t tVar11;
  tm *__tp;
  size_t sVar12;
  long lVar13;
  runtime_error *prVar14;
  size_type *psVar15;
  uint uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *e;
  bool bVar17;
  locale local_1260 [8];
  locale local_1258 [8];
  locale local_1250 [8];
  locale local_1248 [8];
  locale local_1240 [8];
  locale local_1238 [8];
  locale local_1230 [8];
  locale local_1228 [8];
  locale local_1220 [8];
  locale local_1218 [8];
  locale local_1210 [8];
  locale local_1208 [8];
  locale local_1200 [8];
  locale local_11f8 [8];
  locale local_11f0 [8];
  locale local_11e8 [8];
  locale local_11e0 [8];
  locale local_11d8 [8];
  locale local_11d0 [8];
  locale local_11c8 [8];
  locale local_11c0 [8];
  locale local_11b8 [8];
  locale local_11b0 [8];
  locale local_11a8 [8];
  locale local_11a0 [8];
  locale local_1198 [8];
  locale local_1190 [8];
  locale local_1188 [8];
  locale local_1180 [8];
  locale local_1178 [8];
  locale local_1170 [8];
  locale local_1168 [8];
  locale local_1160 [8];
  locale local_1158 [8];
  locale local_1150 [8];
  locale local_1148 [8];
  locale local_1140 [8];
  locale local_1138 [8];
  locale local_1130 [8];
  locale local_1128 [8];
  locale local_1120 [8];
  locale local_1118 [8];
  locale local_1110 [8];
  locale local_1108 [8];
  locale local_1100 [8];
  locale local_10f8 [8];
  locale local_10f0 [8];
  locale local_10e8 [8];
  locale local_10e0 [8];
  locale local_10d8 [8];
  locale local_10d0 [8];
  locale local_10c8 [8];
  locale local_10c0 [8];
  locale local_10b8 [8];
  locale local_10b0 [8];
  locale local_10a8 [8];
  locale local_10a0 [8];
  locale local_1098 [8];
  locale local_1090 [8];
  locale local_1088 [8];
  locale local_1080 [8];
  locale local_1078 [8];
  locale local_1070 [8];
  locale local_1068 [8];
  locale local_1060 [8];
  locale local_1058 [8];
  locale local_1050 [8];
  locale local_1048 [8];
  locale local_1040 [8];
  locale local_1038 [8];
  locale local_1030 [8];
  locale local_1028 [8];
  locale local_1020 [8];
  locale local_1018 [8];
  locale local_1010 [8];
  locale local_1008 [8];
  locale local_1000 [8];
  locale local_ff8 [8];
  locale local_ff0 [8];
  locale local_fe8 [8];
  locale local_fe0 [8];
  locale local_fd8 [8];
  locale local_fd0 [8];
  locale local_fc8 [8];
  locale local_fc0 [8];
  locale local_fb8 [8];
  locale local_fb0 [8];
  locale local_fa8 [8];
  locale local_fa0 [8];
  locale local_f98 [8];
  locale local_f90 [8];
  locale local_f88 [8];
  locale local_f80 [8];
  locale local_f78 [8];
  locale local_f70 [8];
  locale local_f68 [8];
  locale local_f60 [8];
  locale local_f58 [8];
  locale local_f50 [8];
  locale local_f48 [8];
  locale local_f40 [8];
  locale local_f38 [8];
  locale local_f30 [8];
  locale local_f28 [8];
  locale local_f20 [8];
  locale local_f18 [8];
  locale local_f10 [8];
  locale local_f08 [8];
  locale local_f00 [8];
  locale local_ef8 [8];
  locale local_ef0 [8];
  locale local_ee8 [8];
  locale local_ee0 [8];
  locale local_ed8 [8];
  locale local_ed0 [8];
  locale local_ec8 [8];
  locale local_ec0 [8];
  locale local_eb8 [8];
  locale local_eb0 [8];
  locale local_ea8 [8];
  locale local_ea0 [8];
  locale local_e98 [8];
  locale local_e90 [8];
  locale local_e88 [8];
  locale local_e80 [8];
  locale local_e78 [8];
  locale local_e70 [8];
  locale local_e68 [8];
  locale local_e60 [8];
  locale local_e58 [8];
  locale local_e50 [8];
  locale local_e48 [8];
  locale local_e40 [8];
  locale local_e38 [8];
  locale local_e30 [8];
  locale local_e28 [8];
  locale local_e20 [8];
  locale local_e18 [8];
  locale local_e10 [8];
  locale local_e08 [8];
  locale local_e00 [8];
  locale local_df8 [8];
  locale local_df0 [8];
  locale local_de8 [8];
  locale local_de0 [8];
  locale local_dd8 [8];
  locale local_dd0 [8];
  locale local_dc8 [8];
  locale local_dc0 [8];
  locale local_db8 [8];
  locale local_db0 [8];
  locale local_da8 [8];
  locale local_da0 [8];
  locale local_d98 [8];
  locale local_d90 [8];
  locale local_d88 [8];
  locale local_d80 [8];
  locale local_d78 [8];
  locale local_d70 [8];
  locale local_d68 [8];
  locale local_d60 [8];
  locale local_d58 [8];
  locale local_d50 [8];
  locale local_d48 [8];
  locale local_d40 [8];
  locale local_d38 [8];
  locale local_d30 [8];
  locale local_d28 [8];
  locale local_d20 [8];
  locale local_d18 [8];
  locale local_d10 [8];
  locale local_d08 [8];
  locale local_d00 [8];
  long local_cf8;
  locale local_cf0 [8];
  locale local_ce8 [8];
  locale local_ce0 [8];
  locale local_cd8 [8];
  undefined1 *local_cd0;
  ulong local_cc8;
  undefined1 local_cc0 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_cb0;
  locale local_c90 [8];
  locale local_c88 [8];
  locale local_c80 [8];
  locale local_c78 [8];
  locale local_c70 [8];
  locale local_c68 [8];
  locale local_c60 [8];
  locale local_c58 [8];
  locale local_c50 [8];
  locale local_c48 [8];
  locale local_c40 [8];
  locale local_c38 [8];
  locale local_c30 [8];
  locale local_c28 [8];
  locale local_c20 [8];
  locale local_c18 [8];
  locale local_c10 [8];
  locale local_c08 [8];
  locale local_c00 [8];
  locale local_bf8 [8];
  locale local_bf0 [8];
  locale local_be8 [8];
  locale local_be0 [8];
  locale local_bd8 [8];
  locale local_bd0 [8];
  locale local_bc8 [8];
  locale local_bc0 [8];
  locale local_bb8 [8];
  locale local_bb0 [8];
  locale local_ba8 [8];
  locale local_ba0 [8];
  locale local_b98 [8];
  locale local_b90 [8];
  locale local_b88 [8];
  locale local_b80 [8];
  locale local_b78 [8];
  locale local_b70 [8];
  locale local_b68 [8];
  locale local_b60 [8];
  locale local_b58 [8];
  locale local_b50 [8];
  locale local_b48 [8];
  locale local_b40 [8];
  locale local_b38 [8];
  locale local_b30 [8];
  locale local_b28 [8];
  locale local_b20 [8];
  locale local_b18 [8];
  locale local_b10 [8];
  locale local_b08 [8];
  locale local_b00 [8];
  locale local_af8 [8];
  locale local_af0 [8];
  locale local_ae8 [8];
  locale local_ae0 [8];
  locale local_ad8 [8];
  locale local_ad0 [8];
  locale local_ac8 [8];
  locale local_ac0 [8];
  locale local_ab8 [8];
  locale local_ab0 [8];
  locale local_aa8 [8];
  locale local_aa0 [8];
  locale local_a98 [8];
  locale local_a90 [8];
  locale local_a88 [8];
  locale local_a80 [8];
  locale local_a78 [8];
  locale local_a70 [8];
  locale local_a68 [8];
  locale local_a60 [8];
  locale local_a58 [8];
  locale local_a50 [8];
  locale local_a48 [8];
  locale local_a40 [8];
  locale local_a38 [8];
  locale local_a30 [8];
  locale local_a28 [8];
  locale local_a20 [8];
  locale local_a18 [8];
  locale local_a10 [8];
  locale local_a08 [8];
  locale local_a00 [8];
  locale local_9f8 [8];
  locale local_9f0 [8];
  locale local_9e8 [8];
  locale local_9e0 [8];
  locale local_9d8 [8];
  locale local_9d0 [8];
  locale local_9c8 [8];
  locale local_9c0 [8];
  locale local_9b8 [8];
  locale local_9b0 [8];
  locale local_9a8 [8];
  locale local_9a0 [8];
  locale local_998 [8];
  locale local_990 [8];
  locale local_988 [8];
  locale local_980 [8];
  locale local_978 [8];
  locale local_970 [8];
  locale local_968 [8];
  locale local_960 [8];
  locale local_958 [8];
  locale local_950 [8];
  locale local_948 [8];
  locale local_940 [8];
  locale local_938 [8];
  locale local_930 [8];
  locale local_928 [8];
  locale local_920 [8];
  locale local_918 [8];
  locale local_910 [8];
  locale local_908 [8];
  locale local_900 [8];
  locale local_8f8 [8];
  locale local_8f0 [8];
  locale local_8e8 [8];
  locale local_8e0 [8];
  locale local_8d8 [8];
  locale local_8d0 [8];
  locale local_8c8 [8];
  locale local_8c0 [8];
  locale local_8b8 [8];
  locale local_8b0 [8];
  locale local_8a8 [8];
  locale local_8a0 [8];
  locale local_898 [8];
  locale local_890 [8];
  locale local_888 [8];
  locale local_880 [8];
  locale local_878 [8];
  locale local_870 [8];
  locale local_868 [8];
  locale local_860 [8];
  locale local_858 [8];
  locale local_850 [8];
  locale local_848 [8];
  locale local_840 [8];
  locale local_838 [8];
  locale local_830 [8];
  locale local_828 [8];
  locale local_820 [8];
  locale local_818 [8];
  locale local_810 [8];
  locale local_808 [8];
  locale local_800 [8];
  locale local_7f8 [8];
  locale local_7f0 [8];
  locale local_7e8 [8];
  locale local_7e0 [8];
  locale local_7d8 [8];
  locale local_7d0 [8];
  locale local_7c8 [8];
  locale local_7c0 [8];
  locale local_7b8 [8];
  locale local_7b0 [8];
  locale local_7a8 [8];
  locale local_7a0 [8];
  locale local_798 [8];
  locale local_790 [8];
  locale local_788 [8];
  locale local_780 [8];
  generator local_778 [8];
  locale local_770 [8];
  string local_768;
  char *local_748;
  long local_740;
  char local_738 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_728;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_708;
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  undefined8 local_678;
  uint auStack_670 [2];
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  ios_base *local_628 [2];
  ios_base local_618 [8];
  ios_base local_610 [8];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [24];
  long local_340;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_338 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_230 [3];
  ios_base local_1c0 [264];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  string local_38 [8];
  
  booster::locale::generator::generator(local_778);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688,
                 "en_US.",in_RDI);
  booster::locale::generator::generate(local_38);
  if ((undefined8 *)local_688._0_8_ != &local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1260);
  std::locale::~locale(local_1260);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<double>(1200.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1200.1","");
  std::locale::locale(local_c90,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c90);
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  paVar1 = &local_338[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c90);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  paVar2 = &local_230[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"1200.1\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1258);
  std::locale::~locale(local_1258);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"1200.1","");
  std::locale::locale(local_c88,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c88);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c88);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1200.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1250);
  std::locale::~locale(local_1250);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1200.1","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_c80,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c80);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c80);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1200.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1248);
  std::locale::~locale(local_1248);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<double>(1200.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1,200.1","");
  std::locale::locale(local_c78,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c78);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_c78);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"1,200.1\",loc))",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1240);
  std::locale::~locale(local_1240);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"1,200.1","");
  std::locale::locale(local_c70,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c70);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c70);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1200.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1238);
  std::locale::~locale(local_1238);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1,200.1","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_c68,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c68);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c68);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1200.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1200.1)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1230);
  std::locale::~locale(local_1230);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  std::wios::fill();
  *(undefined4 *)((long)local_5a8 + lVar13) = 0x5f;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 6;
  std::wostream::operator<<((wostream *)local_688,0x5fe);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"_1,534","");
  std::locale::locale(local_c60,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c60);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_c60);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"_1,534\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1228);
  std::locale::~locale(local_1228);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xffffff4f | 0x20;
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  std::wios::fill();
  *(undefined4 *)((long)local_5a8 + lVar13) = 0x5f;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 6;
  std::wostream::operator<<((wostream *)local_688,0x5fe);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1,534_","");
  std::locale::locale(local_c58,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c58);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_c58);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"1,534_\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1220);
  std::locale::~locale(local_1220);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,-0x8000);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-32,768","");
  std::locale::locale(local_c50,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c50);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_c50);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"-32,768\",loc))",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1218);
  std::locale::~locale(local_1218);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,0x7fff);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"32,767","");
  std::locale::locale(local_c48,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c48);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_c48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"32,767\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1210);
  std::locale::~locale(local_1210);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"-32,768","");
  std::locale::locale(local_c40,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c40);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c40);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(short *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," (v)==(std::numeric_limits<short>::min())",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar5 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar5;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_230);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar5;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1208);
  std::locale::~locale(local_1208);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-32,768","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_c38,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c38);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c38);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(short *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," (v)==(std::numeric_limits<short>::min())",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar5 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar5;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_230);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar5;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1200);
  std::locale::~locale(local_1200);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"32,767","");
  std::locale::locale(local_c30,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c30);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c30);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(short *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((short)local_708._M_dataplus._M_p != 0x7fff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<short>::max())",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11f8);
  std::locale::~locale(local_11f8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"32,767","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_c28,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c28);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c28);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(short *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((short)local_708._M_dataplus._M_p != 0x7fff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<short>::max())",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_11f0);
  std::locale::~locale(local_11f0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long>((ulong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0","");
  std::locale::locale(local_c20,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c20);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_c20);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_11e8);
  std::locale::~locale(local_11e8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long>((ulong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"65,535","");
  std::locale::locale(local_c18,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_c18);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_c18);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"65,535\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11e0);
  std::locale::~locale(local_11e0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"0","");
  std::locale::locale(local_c10,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c10);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_short>((ushort *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((short)local_708._M_dataplus._M_p != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned short>::min())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11d8);
  std::locale::~locale(local_11d8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_c08,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c08);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c08);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_short>((ushort *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((short)local_708._M_dataplus._M_p != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned short>::min())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11d0);
  std::locale::~locale(local_11d0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"65,535","");
  std::locale::locale(local_c00,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_c00);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_c00);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_short>((ushort *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((short)local_708._M_dataplus._M_p != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned short>::max())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11c8);
  std::locale::~locale(local_11c8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"65,535","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_bf8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_bf8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_short>((ushort *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((short)local_708._M_dataplus._M_p != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned short>::max())",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"-1","");
  std::locale::locale(local_bf0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_bf0);
  std::locale::~locale(local_bf0);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11c0);
  std::locale::~locale(local_11c0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::_M_extract<unsigned_short>((ushort *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xeb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11b8);
  std::locale::~locale(local_11b8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_short>((ushort *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xeb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  bVar17 = short_parsing_fails();
  if (bVar17) {
    local_688._0_8_ = (wstring *)&local_678;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"65,535","");
    std::locale::locale(local_be8,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_688,local_be8);
    std::locale::~locale(local_be8);
    if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
      operator_delete((void *)local_688._0_8_);
    }
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_11b0);
    std::locale::~locale(local_11b0);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    std::wistream::operator>>((wistream *)local_688,(short *)&local_b8);
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xed);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_338[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_338);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_11a8);
    std::locale::~locale(local_11a8);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    lVar13 = *(long *)(local_688._0_8_ + -0x18);
    *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
    std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    test_counter = test_counter + 1;
    std::wistream::operator>>((wistream *)local_688,(short *)&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xed);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (0x14 < error_counter) {
      error_counter = error_counter + 1;
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    error_counter = error_counter + 1;
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_11a0);
  std::locale::~locale(local_11a0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,-0x80000000);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-2,147,483,648","");
  std::locale::locale(local_be0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_be0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_be0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"-2,147,483,648\",loc))",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1198);
  std::locale::~locale(local_1198);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,0x7fffffff);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"2,147,483,647","");
  std::locale::locale(local_bd8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_bd8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_bd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"2,147,483,647\",loc))",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1190);
  std::locale::~locale(local_1190);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"-2,147,483,648","");
  std::locale::locale(local_bd0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_bd0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_bd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," (v)==(std::numeric_limits<int>::min())",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar5 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar5;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_230);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar5;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1188);
  std::locale::~locale(local_1188);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"-2,147,483,648","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_bc8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_bc8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_bc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," (v)==(std::numeric_limits<int>::min())",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar5 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar5;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_230);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar5;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1180);
  std::locale::~locale(local_1180);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"2,147,483,647","");
  std::locale::locale(local_bc0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_bc0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_bc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x7fffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<int>::max())",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1178);
  std::locale::~locale(local_1178);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"2,147,483,647","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_bb8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_bb8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_bb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x7fffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<int>::max())",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1170);
  std::locale::~locale(local_1170);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long>((ulong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0","");
  std::locale::locale(local_bb0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_bb0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_bb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1168);
  std::locale::~locale(local_1168);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long>((ulong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4,294,967,295","");
  std::locale::locale(local_ba8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_ba8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_ba8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"4,294,967,295\",loc))",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1160);
  std::locale::~locale(local_1160);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"0","");
  std::locale::locale(local_ba0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_ba0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_ba0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_int>((uint *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned int>::min())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1158);
  std::locale::~locale(local_1158);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_b98,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b98);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b98);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_int>((uint *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned int>::min())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1150);
  std::locale::~locale(local_1150);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4,294,967,295","");
  std::locale::locale(local_b90,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b90);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b90);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_int>((uint *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned int>::max())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1148);
  std::locale::~locale(local_1148);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4,294,967,295","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_b88,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b88);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b88);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<unsigned_int>((uint *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<unsigned int>::max())",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"-1","");
  std::locale::locale(local_b80,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_b80);
  std::locale::~locale(local_b80);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1140);
  std::locale::~locale(local_1140);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::_M_extract<unsigned_int>((uint *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1138);
  std::locale::~locale(local_1138);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_int>((uint *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"4,294,967,295","");
  std::locale::locale(local_b78,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_b78);
  std::locale::~locale(local_b78);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1130);
  std::locale::~locale(local_1130);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1128);
  std::locale::~locale(local_1128);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xf4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1120);
  std::locale::~locale(local_1120);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b70,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_b70);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_b70);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " (ss.str())==(to_correct_string<CharType>(\"-9,223,372,036,854,775,808\",loc))",0x4c
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1118);
  std::locale::~locale(local_1118);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"9,223,372,036,854,775,807","");
  std::locale::locale(local_b68,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_b68);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_b68);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))",0x4b)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1110);
  std::locale::~locale(local_1110);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b60,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b60);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b60);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long>::min())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1108);
  std::locale::~locale(local_1108);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"-9,223,372,036,854,775,808","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_b58,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b58);
  paVar2 = &local_230[0].field_2;
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b58);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long>::min())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1100);
  std::locale::~locale(local_1100);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"9,223,372,036,854,775,807","");
  std::locale::locale(local_b50,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b50);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b50);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long>::max())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10f8);
  std::locale::~locale(local_10f8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"9,223,372,036,854,775,807","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_b48,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b48);
  paVar2 = &local_230[0].field_2;
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long>::max())",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_10f0);
  std::locale::~locale(local_10f0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long>((ulong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0","");
  std::locale::locale(local_b40,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_b40);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_b40);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)&local_230[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_10e8);
  std::locale::~locale(local_10e8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long>((ulong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"18446744073709551615","");
  std::locale::locale(local_b38,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_b38);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_b38);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  paVar2 = &local_230[0].field_2;
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xfe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"18446744073709551615\",loc))",
               0x46);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"-1","");
  std::locale::locale(local_b30,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_b30);
  std::locale::~locale(local_b30);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10e0);
  std::locale::~locale(local_10e0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::_M_extract<unsigned_long>((ulong *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10d8);
  std::locale::~locale(local_10d8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_long>((ulong *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_10d0);
  std::locale::~locale(local_10d0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<long_long>((longlong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b28,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_b28);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_b28);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " (ss.str())==(to_correct_string<CharType>(\"-9,223,372,036,854,775,808\",loc))",0x4c
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_10c8);
  std::locale::~locale(local_10c8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<long_long>((longlong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"9,223,372,036,854,775,807","");
  std::locale::locale(local_b20,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_b20);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_b20);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))",0x4b)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10c0);
  std::locale::~locale(local_10c0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"-9,223,372,036,854,775,808","");
  std::locale::locale(local_b18,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b18);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b18);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long_long>((longlong *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long long>::min())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10b8);
  std::locale::~locale(local_10b8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"-9,223,372,036,854,775,808","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_b10,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b10);
  paVar2 = &local_230[0].field_2;
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long_long>((longlong *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x8000000000000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long long>::min())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10b0);
  std::locale::~locale(local_10b0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"9,223,372,036,854,775,807","");
  std::locale::locale(local_b08,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b08);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b08);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long_long>((longlong *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long long>::max())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10a8);
  std::locale::~locale(local_10a8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"9,223,372,036,854,775,807","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_b00,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_b00);
  paVar2 = &local_230[0].field_2;
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_b00);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<long_long>((longlong *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x7fffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (v)==(std::numeric_limits<long long>::max())",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_10a0);
  std::locale::~locale(local_10a0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"0","");
  std::locale::locale(local_af8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_af8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_af8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"0\",loc))",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1098);
  std::locale::~locale(local_1098);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"18446744073709551615","");
  std::locale::locale(local_af0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_af0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_af0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"18446744073709551615\",loc))",
               0x46);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1090);
  std::locale::~locale(local_1090);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"9,223,372,036,854,775,807","");
  std::locale::locale(local_ae8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_ae8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_ae8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x106);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))",0x4b)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1088);
  std::locale::~locale(local_1088);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"9223372036854775808","");
  std::locale::locale(local_ae0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_ae0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_ae0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x107);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"9223372036854775808\",loc))",0x45
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"-1","");
  std::locale::locale(local_ad8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_ad8);
  std::locale::~locale(local_ad8);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1080);
  std::locale::~locale(local_1080);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::_M_extract<unsigned_long_long>((ulonglong *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1078);
  std::locale::~locale(local_1078);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_long_long>((ulonglong *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1070);
  std::locale::~locale(local_1070);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 3;
  std::wostream::operator<<((wostream *)local_688,0xf);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"15 ","");
  std::locale::locale(local_ad0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_ad0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"15 \",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1068);
  std::locale::~locale(local_1068);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"15 ","");
  std::locale::locale(local_ac8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_ac8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_ac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 3;
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0xf) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1060);
  std::locale::~locale(local_1060);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"15 ","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_ac0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_ac0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 3;
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0xf) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1058);
  std::locale::~locale(local_1058);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 3;
  std::wostream::operator<<((wostream *)local_688,0xf);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," 15","");
  std::locale::locale(local_ab8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_ab8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_ab8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\" 15\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1050);
  std::locale::~locale(local_1050);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338," 15","");
  std::locale::locale(local_ab0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_ab0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_ab0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 3;
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0xf) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1048);
  std::locale::~locale(local_1048);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," 15","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_aa8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_aa8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_aa8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&local_678 + *(long *)(local_688._0_8_ + -0x18)) = 3;
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0xf) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(15)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_1040);
  std::locale::~locale(local_1040);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  *(undefined8 *)(local_688 + *(long *)(local_688._0_8_ + -0x18) + 8) = 3;
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xfffffefb | 4;
  std::wostream::_M_insert<double>(13.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"13.100","");
  std::locale::locale(local_aa0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_aa0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_aa0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"13.100\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1038);
  std::locale::~locale(local_1038);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"13.100","");
  std::locale::locale(local_a98,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a98);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a98);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(undefined8 *)(local_688 + *(long *)(local_688._0_8_ + -0x18) + 8) = 3;
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xfffffefb | 4;
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 13.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(13.1)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1030);
  std::locale::~locale(local_1030);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"13.100","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_a90,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a90);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a90);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(undefined8 *)(local_688 + *(long *)(local_688._0_8_ + -0x18) + 8) = 3;
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xfffffefb | 4;
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 13.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(13.1)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"");
  std::locale::locale(local_a88,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_a88);
  std::locale::~locale(local_a88);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1028);
  std::locale::~locale(local_1028);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x116);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1020);
  std::locale::~locale(local_1020);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x116);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"--3","");
  std::locale::locale(local_a80,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_a80);
  std::locale::~locale(local_a80);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1018);
  std::locale::~locale(local_1018);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x117);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1010);
  std::locale::~locale(local_1010);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x117);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"y","");
  std::locale::locale(local_a78,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_a78);
  std::locale::~locale(local_a78);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1008);
  std::locale::~locale(local_1008);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1000);
  std::locale::~locale(local_1000);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)local_688,(int *)&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x118);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_ff8);
  std::locale::~locale(local_ff8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<double>(0.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"10%","");
  std::locale::locale(local_a70,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_a70);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_a70);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"10%\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ff0);
  std::locale::~locale(local_ff0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"10%","");
  std::locale::locale(local_a68,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a68);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a68);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 0.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fe8);
  std::locale::~locale(local_fe8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"10%","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_a60,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a60);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a60);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 0.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_fe0);
  std::locale::~locale(local_fe0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(local_688 + *(long *)(local_688._0_8_ + -0x18) + 8) = 1;
  std::wostream::_M_insert<double>(0.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"10.0%","");
  std::locale::locale(local_a58,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_a58);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"10.0%\",loc))",0x37);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fd8);
  std::locale::~locale(local_fd8);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"10.0%","");
  std::locale::locale(local_a50,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a50);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a50);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(local_688 + *(long *)(local_688._0_8_ + -0x18) + 8) = 1;
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 0.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fd0);
  std::locale::~locale(local_fd0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"10.0%","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_a48,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a48);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) =
       *(uint *)((long)auStack_670 + *(long *)(local_688._0_8_ + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(local_688 + *(long *)(local_688._0_8_ + -0x18) + 8) = 1;
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 0.1) || (NAN((double)local_708._M_dataplus._M_p))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(0.1)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"1","");
  std::locale::locale(local_a40,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_a40);
  std::locale::~locale(local_a40);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fc8);
  std::locale::~locale(local_fc8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::_M_extract<double>((double *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fc0);
  std::locale::~locale(local_fc0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_fb8);
  std::locale::~locale(local_fb8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.00","");
  std::locale::locale(local_a38,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_a38);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"$1,345.00\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fb0);
  std::locale::~locale(local_fb0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.00","");
  std::locale::locale(local_a30,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a30);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x541) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fa8);
  std::locale::~locale(local_fa8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.00","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_a28,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a28);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a28);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x541) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_fa0);
  std::locale::~locale(local_fa0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.34","");
  std::locale::locale(local_a20,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_a20);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_a20);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"$1,345.34\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f98);
  std::locale::~locale(local_f98);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.34","");
  std::locale::locale(local_a18,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a18);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a18);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1345.34) || (NAN((double)local_708._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f90);
  std::locale::~locale(local_f90);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.34","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_a10,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_a10);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_a10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1345.34) || (NAN((double)local_708._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"$","");
  std::locale::locale(local_a08,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_a08);
  std::locale::~locale(local_a08);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f88);
  std::locale::~locale(local_f88);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::_M_extract<double>((double *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x122);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f80);
  std::locale::~locale(local_f80);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x122);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_f78);
  std::locale::~locale(local_f78);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::currency_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.00","");
  std::locale::locale(local_a00,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_a00);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_a00);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"$1,345.00\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f70);
  std::locale::~locale(local_f70);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.00","");
  std::locale::locale(local_9f8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9f8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x541) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f68);
  std::locale::~locale(local_f68);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.00","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_9f0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9f0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x541) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_f60);
  std::locale::~locale(local_f60);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::currency_flags(uVar6);
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.34","");
  std::locale::locale(local_9e8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_9e8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_9e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"$1,345.34\",loc))",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f58);
  std::locale::~locale(local_f58);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"$1,345.34","");
  std::locale::locale(local_9e0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9e0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1345.34) || (NAN((double)local_708._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f50);
  std::locale::~locale(local_f50);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"$1,345.34","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_9d8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9d8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1345.34) || (NAN((double)local_708._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x127);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_f48);
  std::locale::~locale(local_f48);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::currency_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"USD1,345.00","");
  std::locale::locale(local_9d0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_9d0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_9d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"USD1,345.00\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f40);
  std::locale::~locale(local_f40);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"USD1,345.00","");
  std::locale::locale(local_9c8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9c8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x541) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f38);
  std::locale::~locale(local_f38);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"USD1,345.00","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_9c0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9c0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 0x541) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345)",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_f30);
  std::locale::~locale(local_f30);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::currency_flags(uVar6);
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"USD1,345.34","");
  std::locale::locale(local_9b8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_9b8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_9b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"USD1,345.34\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f28);
  std::locale::~locale(local_f28);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"USD1,345.34","");
  std::locale::locale(local_9b0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9b0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1345.34) || (NAN((double)local_708._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f20);
  std::locale::~locale(local_f20);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"USD1,345.34","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_9a8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_9a8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_9a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::currency_flags(uVar6);
  pwVar8 = std::wistream::_M_extract<double>((double *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (((double)local_708._M_dataplus._M_p != 1345.34) || (NAN((double)local_708._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(1345.34)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x129);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_f18);
  std::locale::~locale(local_f18);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,10);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ten","");
  std::locale::locale(local_9a0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_9a0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_9a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"ten\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f10);
  std::locale::~locale(local_f10);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"ten","");
  std::locale::locale(local_998,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_998);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(10)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f08);
  std::locale::~locale(local_f08);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ten","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_990,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_990);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  pwVar8 = (wistream *)std::wistream::operator>>((wistream *)local_688,(int *)&local_708);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if ((int)local_708._M_dataplus._M_p != 10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(10)",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,299);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_f00);
  std::locale::~locale(local_f00);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  std::wostream::operator<<((wostream *)local_688,1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1st","");
  std::locale::locale(local_988,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_988);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_988);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x131);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"1st\",loc))",0x35);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_ef8);
  std::locale::~locale(local_ef8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Feb 5, 1970","");
  std::locale::locale(local_980,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_980);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_980);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ef0);
  std::locale::~locale(local_ef0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"Feb 5, 1970","");
  std::locale::locale(local_978,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_978);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_978);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ee8);
  std::locale::~locale(local_ee8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Feb 5, 1970","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_970,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_970);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_970);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_ee0);
  std::locale::~locale(local_ee0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"2/5/70","");
  std::locale::locale(local_968,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_968);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_968);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"2/5/70\",loc))",0x38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ed8);
  std::locale::~locale(local_ed8);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"2/5/70","");
  std::locale::locale(local_960,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_960);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_960);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ed0);
  std::locale::~locale(local_ed0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"2/5/70","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_958,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_958);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_958);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_ec8);
  std::locale::~locale(local_ec8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Feb 5, 1970","");
  std::locale::locale(local_950,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_950);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_950);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\",loc))",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ec0);
  std::locale::~locale(local_ec0);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"Feb 5, 1970","");
  std::locale::locale(local_948,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_948);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_948);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_eb8);
  std::locale::~locale(local_eb8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Feb 5, 1970","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_940,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_940);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_940);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_eb0);
  std::locale::~locale(local_eb0);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"February 5, 1970","");
  std::locale::locale(local_938,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_938);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_938);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"February 5, 1970\",loc))",0x42);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ea8);
  std::locale::~locale(local_ea8);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"February 5, 1970","");
  std::locale::locale(local_930,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_930);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_930);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ea0);
  std::locale::~locale(local_ea0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"February 5, 1970","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_928,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_928);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_e98);
  std::locale::~locale(local_e98);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"Thursday, February 5, 1970","");
  std::locale::locale(local_920,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_920);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_920);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " (ss.str())==(to_correct_string<CharType>(\"Thursday, February 5, 1970\",loc))",0x4c
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e90);
  std::locale::~locale(local_e90);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"Thursday, February 5, 1970","");
  std::locale::locale(local_918,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_918);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_918);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e88);
  std::locale::~locale(local_e88);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"Thursday, February 5, 1970","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_910,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_910);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_910);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0x2e2480) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"aa/bb/cc","");
  std::locale::locale(local_908,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_908);
  std::locale::~locale(local_908);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e80);
  std::locale::~locale(local_e80);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  std::wistream::_M_extract<double>((double *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e78);
  std::locale::~locale(local_e78);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::date_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x13f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar14,(string *)local_338);
    __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_e70);
  std::locale::~locale(local_e70);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33:13 PM","");
  std::locale::locale(local_900,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_900);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_900);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM\",loc))",0x3c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e68);
  std::locale::~locale(local_e68);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33:13 PM","");
  std::locale::locale(local_8f8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8f8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e60);
  std::locale::~locale(local_e60);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33:13 PM","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_8f0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8f0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x147);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_e58);
  std::locale::~locale(local_e58);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33 PM","");
  std::locale::locale(local_8e8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_8e8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_8e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"3:33 PM\",loc))",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e50);
  std::locale::~locale(local_e50);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33 PM","");
  std::locale::locale(local_8e0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8e0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdaac) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e48);
  std::locale::~locale(local_e48);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33 PM","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_8d8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8d8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdaac) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time)",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x148);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_e40);
  std::locale::~locale(local_e40);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33:13 PM","");
  std::locale::locale(local_8d0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_8d0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_8d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM\",loc))",0x3c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e38);
  std::locale::~locale(local_e38);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33:13 PM","");
  std::locale::locale(local_8c8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8c8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e30);
  std::locale::~locale(local_e30);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33:13 PM","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_8c0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8c0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x149);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_e28);
  std::locale::~locale(local_e28);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33:13 PM GMT","");
  std::locale::locale(local_8b8,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_8b8);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM GMT\",loc))",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e20);
  std::locale::~locale(local_e20);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"3:33:13 PM GMT","");
  std::locale::locale(local_8b0,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8b0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e18);
  std::locale::~locale(local_e18);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"3:33:13 PM GMT","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_8a8,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_8a8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_8a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
  std::wios::imbue(local_e10);
  std::locale::~locale(local_e10);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)))
  ;
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::wostream::_M_insert<long>((long)local_688);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"3:33:13 PM Greenwich Mean Time","");
  std::locale::locale(local_8a0,(locale *)local_38);
  to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_8a0);
  _Var4._M_p = local_338[0]._M_dataplus._M_p;
  if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
    if (local_230[0]._M_string_length == 0) {
      bVar17 = true;
    }
    else {
      iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                      local_230[0]._M_string_length);
      bVar17 = iVar5 == 0;
    }
  }
  else {
    bVar17 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)_Var4._M_p != paVar1) {
    operator_delete(_Var4._M_p);
  }
  std::locale::~locale(local_8a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  if (!bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM \" \"Greenwich Mean Time\",loc))"
               ,0x53);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
  std::ios_base::~ios_base(local_618);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e08);
  std::locale::~locale(local_e08);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"3:33:13 PM Greenwich Mean Time","");
  std::locale::locale(local_898,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_898);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_898);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e00);
  std::locale::~locale(local_e00);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"3:33:13 PM Greenwich Mean Time","");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar15) {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0].field_2._8_8_ = plVar9[3];
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_338[0].field_2._0_8_ = *psVar15;
    local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338[0]._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_890,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_338,local_890);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  std::locale::~locale(local_890);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_338[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_338[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::time_flags(uVar6);
  psVar10 = (string *)
            booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
  local_230[0]._M_string_length = 3;
  local_230[0]._M_dataplus._M_p = (pointer)paVar2;
  booster::locale::ios_info::time_zone(psVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_230[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
  *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
       *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar8,(wchar_t *)local_338);
  test_counter = test_counter + 1;
  if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_230[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_230);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  local_688._0_8_ = (wstring *)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"AM","");
  std::locale::locale(local_888,(locale *)local_38);
  to_correct_string<wchar_t>(local_230,(string *)local_688,local_888);
  std::locale::~locale(local_888);
  if ((wstring *)local_688._0_8_ != (wstring *)&local_678) {
    operator_delete((void *)local_688._0_8_);
  }
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_df8);
  std::locale::~locale(local_df8);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::wistream::_M_extract<double>((double *)local_688);
  test_counter = test_counter + 1;
  if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x155);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.fail()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar17 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar14,(string *)local_338);
      __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
  std::ios_base::~ios_base(local_610);
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_df0);
  std::locale::~locale(local_df0);
  std::__cxx11::wstringbuf::str((wstring *)&local_678);
  lVar13 = *(long *)(local_688._0_8_ + -0x18);
  *(undefined4 *)((long)auStack_670 + lVar13 + 4) = 4;
  std::wios::clear((int)lVar13 + (int)&stack0xfffffffffffffff8 + 0xfffff980);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x155);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss >> v",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (error_counter < 0x15) {
    error_counter = error_counter + 1;
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_de8);
    std::locale::~locale(local_de8);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    std::wostream::_M_insert<long>((long)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM","");
    std::locale::locale(local_880,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_880);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_880);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM\",loc))",0x3c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_de0);
    std::locale::~locale(local_de0);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM","");
    std::locale::locale(local_878,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_878);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_878);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_dd8);
    std::locale::~locale(local_dd8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_870,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_870);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_870);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x157);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_dd0);
    std::locale::~locale(local_dd0);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    std::wostream::_M_insert<long>((long)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33 PM","");
    std::locale::locale(local_868,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_868);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_868);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," (ss.str())==(to_correct_string<CharType>(\"4:33 PM\",loc))",0x39);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_dc8);
    std::locale::~locale(local_dc8);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33 PM","");
    std::locale::locale(local_860,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_860);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_860);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdaac) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time)",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_dc0);
    std::locale::~locale(local_dc0);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33 PM","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_858,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_858);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_858);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdaac) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time)",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_db8);
    std::locale::~locale(local_db8);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    std::wostream::_M_insert<long>((long)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM","");
    std::locale::locale(local_850,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_850);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_850);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM\",loc))",0x3c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_db0);
    std::locale::~locale(local_db0);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM","");
    std::locale::locale(local_848,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_848);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_848);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_da8);
    std::locale::~locale(local_da8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_840,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_840);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_840);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x159);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_da0);
    std::locale::~locale(local_da0);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    std::wostream::_M_insert<long>((long)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM GMT+1","");
    std::locale::locale(local_838,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_838);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_838);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM \" \"GMT+1\",loc))",
                 0x45);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d98);
    std::locale::~locale(local_d98);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM GMT+1","");
    std::locale::locale(local_830,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_830);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d90);
    std::locale::~locale(local_d90);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM GMT+1","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_828,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_828);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_828);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_d88);
    std::locale::~locale(local_d88);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    std::wostream::_M_insert<long>((long)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM GMT+01:00","");
    std::locale::locale(local_820,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_820);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM GMT+01:00\",loc))",
                 0x46);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d80);
    std::locale::~locale(local_d80);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"4:33:13 PM GMT+01:00","");
    std::locale::locale(local_818,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_818);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_818);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d78);
    std::locale::~locale(local_d78);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"4:33:13 PM GMT+01:00","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_810,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_810);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_810);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    local_230[0]._M_string_length = 0;
    local_230[0].field_2._M_local_buf[0] = local_230[0].field_2._M_local_buf[0] & 0xffffff00;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)local_230,0,(char *)0x0,0x188e3a);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_zone(psVar10);
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0xdab9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_time+a_timesec)",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x16e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_d70);
    std::locale::~locale(local_d70);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::wostream::_M_insert<long>((long)local_688);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Feb 5, 1970, 3:33:13 PM","");
    std::locale::locale(local_808,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_808);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_808);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                 ,0x4f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d68);
    std::locale::~locale(local_d68);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Feb 5, 1970, 3:33:13 PM","");
    std::locale::locale(local_800,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_800);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_800);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d60);
    std::locale::~locale(local_d60);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Feb 5, 1970, 3:33:13 PM","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_7f8,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7f8);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x171);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_d58);
    std::locale::~locale(local_d58);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::wostream::_M_insert<long>((long)local_688);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"2/5/70, 3:33 PM","");
    std::locale::locale(local_7f0,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_7f0);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_7f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 " (ss.str())==(to_correct_string<CharType>(\"2/5/70\" \",\" \" 3:33 PM\",loc))",
                 0x47);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d50);
    std::locale::~locale(local_d50);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"2/5/70, 3:33 PM","");
    std::locale::locale(local_7e8,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7e8);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff2c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date+a_time)",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d48);
    std::locale::~locale(local_d48);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"2/5/70, 3:33 PM","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_7e0,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7e0);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff2c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_date+a_time)",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x172);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_d40);
    std::locale::~locale(local_d40);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::wostream::_M_insert<long>((long)local_688);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Feb 5, 1970, 3:33:13 PM","");
    std::locale::locale(local_7d8,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_7d8);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_7d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                 ,0x4f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d38);
    std::locale::~locale(local_d38);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Feb 5, 1970, 3:33:13 PM","");
    std::locale::locale(local_7d0,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7d0);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d30);
    std::locale::~locale(local_d30);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Feb 5, 1970, 3:33:13 PM","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_7c8,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7c8);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x173);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_d28);
    std::locale::~locale(local_d28);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::wostream::_M_insert<long>((long)local_688);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"February 5, 1970 at 3:33:13 PM GMT","");
    std::locale::locale(local_7c0,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_7c0);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_7c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 " (ss.str())==(to_correct_string<CharType>(\"February 5, 1970\" \" at\" \" 3:33:13 PM GMT\",loc))"
                 ,0x5a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d20);
    std::locale::~locale(local_d20);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"February 5, 1970 at 3:33:13 PM GMT","");
    std::locale::locale(local_7b8,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7b8);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d18);
    std::locale::~locale(local_d18);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"February 5, 1970 at 3:33:13 PM GMT","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_7b0,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7b0);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x175);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_d10);
    std::locale::~locale(local_d10);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)
                       ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::wostream::_M_insert<long>((long)local_688);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",""
              );
    std::locale::locale(local_7a8,(locale *)local_38);
    to_correct_string<wchar_t>(local_338,(string *)&local_b8,local_7a8);
    _Var4._M_p = local_338[0]._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_338[0]._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_338[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_7a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 " (ss.str())==(to_correct_string<CharType>(\"Thursday, February 5, 1970\" \" at\" \" 3:33:13 PM \" \"Greenwich Mean Time\",loc))"
                 ,0x77);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d08);
    std::locale::~locale(local_d08);
    local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",""
              );
    std::locale::locale(local_7a0,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_7a0);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_7a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar8);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((*(byte *)((long)local_668 + *(long *)(local_688._0_8_ + -0x18)) & 2) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ss.eof()",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d00);
    std::locale::~locale(local_d00);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",""
              );
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)psVar15) {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0].field_2._8_8_ = plVar9[3];
      local_338[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338[0].field_2._0_8_ = *psVar15;
      local_338[0]._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_338[0]._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::locale::locale(local_798,(locale *)local_38);
    to_correct_string<wchar_t>(local_230,(string *)local_338,local_798);
    std::__cxx11::wstringbuf::str((wstring *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::locale::~locale(local_798);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_338[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_338[0]._M_dataplus._M_p);
    }
    paVar1 = &local_b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::display_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::date_flags(uVar6);
    uVar6 = booster::locale::ios_info::get
                      ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::ios_info::time_flags(uVar6);
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)(local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    pwVar8 = std::wistream::_M_extract<long>((long *)local_688);
    *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) =
         *(uint *)(pwVar8 + *(long *)(*(long *)pwVar8 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar8,(wchar_t *)local_338);
    test_counter = test_counter + 1;
    if (local_708._M_dataplus._M_p != (pointer)0x2eff39) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (v)==(a_datetime)",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((int)local_338[0]._M_dataplus._M_p != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x178);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," tmp_c==\'@\'",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_688);
    std::ios_base::~ios_base(local_610);
    tVar11 = time((time_t *)0x0);
    local_cf8 = tVar11 + 0x3840;
    local_748 = local_738;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"%H:%M:%S","");
    local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
    std::__cxx11::wstring::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((wstring *)&local_728,local_748,local_748 + local_740);
    __format = local_748;
    __tp = gmtime(&local_cf8);
    strftime((char *)local_338,0x100,__format,__tp);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_cf0);
    std::locale::~locale(local_cf0);
    booster::locale::as::ftime<wchar_t>((add_ftime<wchar_t> *)local_230,&local_728);
    booster::locale::as::details::add_ftime<wchar_t>::apply
              ((add_ftime<wchar_t> *)local_230,
               (basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
               ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    std::wostream::_M_insert<long>((long)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    sVar12 = strlen((char *)local_338);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_708,local_338,(long)&local_338[0]._M_dataplus._M_p + sVar12);
    std::locale::locale(local_790,(locale *)local_38);
    to_correct_string<wchar_t>(&local_b8,(string *)&local_708,local_790);
    _Var4._M_p = local_b8._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_b8._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_790);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    paVar2 = &local_230[0].field_2;
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x185);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))",0x3e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_688);
    std::wios::imbue(local_ce8);
    std::locale::~locale(local_ce8);
    booster::locale::as::ftime<wchar_t>((add_ftime<wchar_t> *)&local_b8,&local_728);
    booster::locale::as::details::add_ftime<wchar_t>::apply
              ((add_ftime<wchar_t> *)&local_b8,
               (basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
               ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    local_230[0].field_2._M_local_buf[0] = L'\x00544d47';
    local_230[0]._M_string_length = 3;
    local_230[0]._M_dataplus._M_p = (pointer)paVar2;
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    psVar10 = (string *)
              booster::locale::ios_info::get
                        ((ios_base *)
                         ((wostringstream *)local_688 + *(long *)(local_688._0_8_ + -0x18)));
    booster::locale::time_zone::global_abi_cxx11_();
    booster::locale::ios_info::time_zone(psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    std::wostream::_M_insert<long>((long)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    sVar12 = strlen((char *)local_338);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_708,local_338,(long)&local_338[0]._M_dataplus._M_p + sVar12);
    std::locale::locale(local_788,(locale *)local_38);
    to_correct_string<wchar_t>(&local_b8,(string *)&local_708,local_788);
    _Var4._M_p = local_b8._M_dataplus._M_p;
    if (local_230[0]._M_string_length == local_b8._M_string_length) {
      if (local_230[0]._M_string_length == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = wmemcmp(local_230[0]._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                        local_230[0]._M_string_length);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p);
    }
    std::locale::~locale(local_788);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    if (!bVar17) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x186);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))",0x3e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar17 = 0x14 < error_counter;
      error_counter = iVar5;
      if (bVar17) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_230[0]._M_dataplus._M_p = (pointer)&local_230[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar14,(string *)local_230);
        __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_688);
    std::ios_base::~ios_base(local_618);
    local_cd0 = local_cc0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_cd0,"aAbBcdehHIjmMnprRStTxXyYZ%","");
    local_688._0_8_ = (wstring *)&local_678;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"Thu","");
    local_668[0] = local_658;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"Thursday","");
    local_648[0] = local_638;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"Feb","");
    local_628[0] = local_618;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"February","");
    local_608[0] = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",""
              );
    local_5e8[0] = local_5d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"05","");
    local_5c8[0] = local_5b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"5","");
    local_5a8[0] = local_598;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"Feb","");
    local_588[0] = local_578;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"15","");
    local_568[0] = local_558;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"03","");
    local_548[0] = local_538;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"36","");
    local_528[0] = local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"02","");
    local_508[0] = local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"33","");
    local_4e8[0] = local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"\n","");
    local_4c8[0] = local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"PM","");
    local_4a8[0] = local_498;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"03:33:13 PM","");
    local_488[0] = local_478;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"15:33","");
    local_468[0] = local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"13","");
    local_448[0] = local_438;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"\t","");
    local_428[0] = local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"15:33:13","");
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Feb 5, 1970","");
    local_3e8[0] = local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"3:33:13 PM","");
    local_3c8[0] = local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"70","");
    local_3a8[0] = local_398;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"1970","");
    local_388[0] = local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Greenwich Mean Time","");
    local_368[0] = local_358;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"%","");
    if (local_cc8 != 0) {
      uVar16 = 1;
      uVar6 = 0;
      do {
        local_728._M_string_length = 0;
        *local_728._M_dataplus._M_p = L'\0';
        std::__cxx11::wstring::push_back((wchar_t)&local_728);
        std::__cxx11::wstring::push_back((wchar_t)&local_728);
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_230);
        std::wios::imbue(local_ce0);
        std::locale::~locale(local_ce0);
        booster::locale::as::ftime<wchar_t>((add_ftime<wchar_t> *)&local_708,&local_728);
        booster::locale::as::details::add_ftime<wchar_t>::apply
                  ((add_ftime<wchar_t> *)&local_708,
                   (basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
                   ((long)&local_230[0]._M_dataplus._M_p +
                   *(long *)(local_230[0]._M_dataplus._M_p + -6)));
        psVar10 = (string *)
                  booster::locale::ios_info::get
                            ((ios_base *)
                             ((long)&local_230[0]._M_dataplus._M_p +
                             *(long *)(local_230[0]._M_dataplus._M_p + -6)));
        local_b8.field_2._M_local_buf[0]._2_1_ = 0x54;
        local_b8.field_2._M_local_buf[0]._0_2_ = 0x4d47;
        local_b8._M_string_length = 3;
        local_b8.field_2._M_local_buf[0]._3_1_ = 0;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        booster::locale::ios_info::time_zone(psVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        std::wostream::_M_insert<long>((long)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_708._M_dataplus._M_p != &local_708.field_2) {
          operator_delete(local_708._M_dataplus._M_p);
        }
        test_counter = test_counter + 1;
        std::__cxx11::wstringbuf::str();
        std::locale::locale(local_780,(locale *)local_38);
        to_correct_string<wchar_t>(&local_708,(string *)(local_688 + uVar6 * 0x20),local_780);
        _Var4._M_p = local_708._M_dataplus._M_p;
        if (local_b8._M_string_length == local_708._M_string_length) {
          if (local_b8._M_string_length == 0) {
            bVar17 = true;
          }
          else {
            iVar5 = wmemcmp(local_b8._M_dataplus._M_p,local_708._M_dataplus._M_p,
                            local_b8._M_string_length);
            bVar17 = iVar5 == 0;
          }
        }
        else {
          bVar17 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)_Var4._M_p != &local_708.field_2) {
          operator_delete(_Var4._M_p);
        }
        std::locale::~locale(local_780);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (!bVar17) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," (ss.str())==(to_correct_string<CharType>(result[i],loc))",0x39);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar17 = 0x14 < error_counter;
          error_counter = iVar5;
          if (bVar17) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar14,(string *)&local_b8);
            __cxa_throw(prVar14,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_230);
        std::ios_base::~ios_base(local_1c0);
        uVar6 = (ulong)uVar16;
        uVar16 = uVar16 + 1;
      } while (uVar6 < local_cc8);
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Now is %A, %H o\'clo\'\'ck \' or not \' ","");
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"\'test %H\'","");
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"%H\'","");
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\'%H\'","");
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_708,"Now is Thursday, 15 o\'clo\'\'ck \' or not \' ","");
    local_6e8[0] = local_6d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"\'test 15\'","");
    local_6c8[0] = local_6b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"15\'","");
    local_6a8[0] = local_698;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"\'15\'","");
    lVar13 = 0;
    do {
      lVar3 = *(long *)((long)&local_b8._M_dataplus._M_p + lVar13);
      local_340 = lVar13;
      std::__cxx11::wstring::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((wstring *)&local_728,local_728._M_dataplus._M_p,
                 local_728._M_dataplus._M_p + local_728._M_string_length,lVar3,
                 *(long *)((long)local_98 + lVar13 + -0x18) + lVar3);
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_230);
      std::wios::imbue(local_cd8);
      std::locale::~locale(local_cd8);
      booster::locale::as::ftime<wchar_t>((add_ftime<wchar_t> *)&local_cb0,&local_728);
      booster::locale::as::details::add_ftime<wchar_t>::apply
                ((add_ftime<wchar_t> *)&local_cb0,
                 (basic_ios<wchar_t,_std::char_traits<wchar_t>_> *)
                 ((long)&local_230[0]._M_dataplus._M_p +
                 *(long *)(local_230[0]._M_dataplus._M_p + -6)));
      psVar10 = (string *)
                booster::locale::ios_info::get
                          ((ios_base *)
                           ((long)&local_230[0]._M_dataplus._M_p +
                           *(long *)(local_230[0]._M_dataplus._M_p + -6)));
      local_768.field_2._M_local_buf[2] = 'T';
      local_768.field_2._M_allocated_capacity._0_2_ = 0x4d47;
      local_768._M_string_length = 3;
      local_768.field_2._M_local_buf[3] = '\0';
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      booster::locale::ios_info::time_zone(psVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p);
      }
      std::wostream::_M_insert<long>((long)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
        operator_delete(local_cb0._M_dataplus._M_p);
      }
      test_counter = test_counter + 1;
      std::__cxx11::wstringbuf::str();
      e = (string *)((long)&local_708._M_dataplus._M_p + local_340);
      std::locale::locale(local_770,(locale *)local_38);
      to_correct_string<wchar_t>(&local_cb0,e,local_770);
      _Var4._M_p = local_cb0._M_dataplus._M_p;
      if (local_768._M_string_length == local_cb0._M_string_length) {
        if (local_768._M_string_length == 0) {
          bVar17 = true;
        }
        else {
          iVar5 = wmemcmp((wchar_t *)local_768._M_dataplus._M_p,local_cb0._M_dataplus._M_p,
                          local_768._M_string_length);
          bVar17 = iVar5 == 0;
        }
      }
      else {
        bVar17 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)_Var4._M_p != &local_cb0.field_2) {
        operator_delete(_Var4._M_p);
      }
      std::locale::~locale(local_770);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p);
      }
      if (!bVar17) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x1ba);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," (ss.str())==(to_correct_string<CharType>(expected_f[i],loc))",0x3d);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar5 = error_counter + 1;
        bVar17 = 0x14 < error_counter;
        error_counter = iVar5;
        if (bVar17) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_768,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar14,&local_768);
          __cxa_throw(prVar14,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_230);
      std::ios_base::~ios_base(local_1c0);
      lVar13 = local_340 + 0x20;
    } while (lVar13 != 0x80);
    lVar13 = 0;
    do {
      if (local_698 + lVar13 != *(undefined1 **)((long)local_6a8 + lVar13)) {
        operator_delete(*(undefined1 **)((long)local_6a8 + lVar13));
      }
      lVar13 = lVar13 + -0x20;
    } while (lVar13 != -0x80);
    lVar13 = 0;
    do {
      if (local_48 + lVar13 != *(undefined1 **)((long)local_58 + lVar13)) {
        operator_delete(*(undefined1 **)((long)local_58 + lVar13));
      }
      lVar13 = lVar13 + -0x20;
    } while (lVar13 != -0x80);
    lVar13 = 0;
    do {
      if (local_358 + lVar13 != *(undefined1 **)((long)local_368 + lVar13)) {
        operator_delete(*(undefined1 **)((long)local_368 + lVar13));
      }
      lVar13 = lVar13 + -0x20;
    } while (lVar13 != -0x340);
    if (local_cd0 != local_cc0) {
      operator_delete(local_cd0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_728._M_dataplus._M_p != &local_728.field_2) {
      operator_delete(local_728._M_dataplus._M_p);
    }
    if (local_748 != local_738) {
      operator_delete(local_748);
    }
    std::locale::~locale((locale *)local_38);
    booster::locale::generator::~generator(local_778);
    return;
  }
  error_counter = error_counter + 1;
  prVar14 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_338[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"Error limits reached, stopping unit test","");
  booster::runtime_error::runtime_error(prVar14,(string *)local_338);
  __cxa_throw(prVar14,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_manip(std::string e_charset="UTF-8")
{
    booster::locale::generator g;
    std::locale loc=g("en_US."+e_charset);
    
    TEST_FP1(as::posix,1200.1,"1200.1",double,1200.1);
    TEST_FP1(as::number,1200.1,"1,200.1",double,1200.1);
    TEST_FMT(as::number<<std::setfill(CharType('_'))<<std::setw(6),1534,"_1,534");
    TEST_FMT(as::number<<std::left<<std::setfill(CharType('_'))<<std::setw(6),1534,"1,534_");
    
    // Ranges
    if(sizeof(short) == 2) {
        TEST_MIN_MAX(short,"-32,768","32,767");
        TEST_MIN_MAX(unsigned short,"0","65,535");
        TEST_NOPAR(as::number,"-1",unsigned short);
        if(short_parsing_fails()) {
            TEST_NOPAR(as::number,"65,535",short);
        }
    }
    if(sizeof(int)==4) {
        TEST_MIN_MAX(int,"-2,147,483,648","2,147,483,647");
        TEST_MIN_MAX(unsigned int,"0","4,294,967,295");
        TEST_NOPAR(as::number,"-1",unsigned int);
        TEST_NOPAR(as::number,"4,294,967,295",int);
    }
    if(sizeof(long)==4) {
        TEST_MIN_MAX(long,"-2,147,483,648","2,147,483,647");
        TEST_MIN_MAX(unsigned long,"0","4,294,967,295");
        TEST_NOPAR(as::number,"-1",unsigned long);
        TEST_NOPAR(as::number,"4,294,967,295",long);
    }
    if(sizeof(long)==8) {
        TEST_MIN_MAX(long,"-9,223,372,036,854,775,808","9,223,372,036,854,775,807");
        TEST_MIN_MAX_FMT(unsigned long,"0","18446744073709551615"); // Unsupported range by icu - ensure fallback
        TEST_NOPAR(as::number,"-1",unsigned long);
    }
    #ifndef BOOSTER_NO_LONG_LONG
    if(sizeof(long long)==8) {
        TEST_MIN_MAX(long long,"-9,223,372,036,854,775,808","9,223,372,036,854,775,807");
        // we can't really parse this as ICU does not support this range, only format
        TEST_MIN_MAX_FMT(unsigned long long,"0","18446744073709551615"); // Unsupported range by icu - ensure fallback
        TEST_FMT(as::number,9223372036854775807ULL,"9,223,372,036,854,775,807");
        TEST_FMT(as::number,9223372036854775808ULL,"9223372036854775808"); // Unsupported range by icu - ensure fallback
        TEST_NOPAR(as::number,"-1",unsigned long long);
    }
    #endif



    TEST_FP3(as::number,std::left,std::setw(3),15,"15 ",int,15);
    TEST_FP3(as::number,std::right,std::setw(3),15," 15",int,15);
    TEST_FP3(as::number,std::setprecision(3),std::fixed,13.1,"13.100",double,13.1);
    #if BOOSTER_ICU_VER < 5601 
    // bug #13276
    TEST_FP3(as::number,std::setprecision(3),std::scientific,13.1,"1.310E1",double,13.1);
    #endif

    TEST_NOPAR(as::number,"",int);
    TEST_NOPAR(as::number,"--3",int);
    TEST_NOPAR(as::number,"y",int);

    TEST_FP1(as::percent,0.1,"10%",double,0.1);
    TEST_FP3(as::percent,std::fixed,std::setprecision(1),0.10,"10.0%",double,0.1);

    TEST_NOPAR(as::percent,"1",double);

    TEST_FP1(as::currency,1345,"$1,345.00",int,1345);
    TEST_FP1(as::currency,1345.34,"$1,345.34",double,1345.34);

    TEST_NOPAR(as::currency,"$",double);


    #if BOOSTER_ICU_VER >= 402
    TEST_FP2(as::currency,as::currency_national,1345,"$1,345.00",int,1345);
    TEST_FP2(as::currency,as::currency_national,1345.34,"$1,345.34",double,1345.34);
    TEST_FP2(as::currency,as::currency_iso,1345,"USD1,345.00",int,1345);
    TEST_FP2(as::currency,as::currency_iso,1345.34,"USD1,345.34",double,1345.34);
    #endif
    TEST_FP1(as::spellout,10,"ten",int,10);
    #if 402 <= BOOSTER_ICU_VER && BOOSTER_ICU_VER < 408
    if(e_charset=="UTF-8") {
        TEST_FMT(as::ordinal,1,"1\xcb\xa2\xe1\xb5\x97"); // 1st with st as ligatures
    }
    #else
        TEST_FMT(as::ordinal,1,"1st");
    #endif

    time_t a_date = 3600*24*(31+4); // Feb 5th
    time_t a_time = 3600*15+60*33; // 15:33:05
    time_t a_timesec = 13;
    time_t a_datetime = a_date + a_time + a_timesec;

    TEST_FP2(as::date,                as::gmt,a_datetime,"Feb 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_short ,as::gmt,a_datetime,"2/5/70",time_t,a_date);
    TEST_FP3(as::date,as::date_medium,as::gmt,a_datetime,"Feb 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_long  ,as::gmt,a_datetime,"February 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970",time_t,a_date);
    
    TEST_NOPAR(as::date>>as::date_short,"aa/bb/cc",double);

#if BOOSTER_ICU_VER >= 5901
#define GMT_FULL "Greenwich Mean Time"
#else
#define GMT_FULL "GMT"
#endif
    
    TEST_FP2(as::time,                as::gmt,a_datetime,"3:33:13 PM",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_short ,as::gmt,a_datetime,"3:33 PM",time_t,a_time);
    TEST_FP3(as::time,as::time_medium,as::gmt,a_datetime,"3:33:13 PM",time_t,a_time+a_timesec);
    #if BOOSTER_ICU_VER >= 408
    TEST_FP3(as::time,as::time_long  ,as::gmt,a_datetime,"3:33:13 PM GMT",time_t,a_time+a_timesec);
        #if BOOSTER_ICU_EXACT_VER != 40800
            // know bug #8675
            TEST_FP3(as::time,as::time_full  ,as::gmt,a_datetime,"3:33:13 PM " GMT_FULL,time_t,a_time+a_timesec);
        #endif
    #else
    TEST_FP3(as::time,as::time_long  ,as::gmt,a_datetime,"3:33:13 PM GMT+00:00",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_full  ,as::gmt,a_datetime,"3:33:13 PM GMT+00:00",time_t,a_time+a_timesec);
    #endif
    
    TEST_NOPAR(as::time,"AM",double);

    TEST_FP2(as::time,                as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_short ,as::time_zone("GMT+01:00"),a_datetime,"4:33 PM",time_t,a_time);
    TEST_FP3(as::time,as::time_medium,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM",time_t,a_time+a_timesec);

#if U_ICU_VERSION_MAJOR_NUM >= 52
#define GMT_P100 "GMT+1"
#else
#define GMT_P100 "GMT+01:00"
#endif


#if U_ICU_VERSION_MAJOR_NUM >= 50
#define PERIOD "," 
#define ICUAT " at"
#else
#define PERIOD ""
#define ICUAT ""
#endif

    TEST_FP3(as::time,as::time_long  ,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM "  GMT_P100,time_t,a_time+a_timesec);
    #if BOOSTER_ICU_VER == 308 && defined(__CYGWIN__)
    // Known faliture ICU issue
    #else
    TEST_FP3(as::time,as::time_full  ,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM GMT+01:00",time_t,a_time+a_timesec);
    #endif

    TEST_FP2(as::datetime,                                as::gmt,a_datetime,"Feb 5, 1970" PERIOD  " 3:33:13 PM",time_t,a_datetime);
    TEST_FP4(as::datetime,as::date_short ,as::time_short ,as::gmt,a_datetime,"2/5/70" PERIOD " 3:33 PM",time_t,a_date+a_time);
    TEST_FP4(as::datetime,as::date_medium,as::time_medium,as::gmt,a_datetime,"Feb 5, 1970" PERIOD " 3:33:13 PM",time_t,a_datetime);
    #if BOOSTER_ICU_VER >= 408
    TEST_FP4(as::datetime,as::date_long  ,as::time_long  ,as::gmt,a_datetime,"February 5, 1970" ICUAT " 3:33:13 PM GMT",time_t,a_datetime);
        #if BOOSTER_ICU_EXACT_VER != 40800
            // know bug #8675
            TEST_FP4(as::datetime,as::date_full  ,as::time_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970" ICUAT " 3:33:13 PM " GMT_FULL,time_t,a_datetime);
        #endif
    #else
    TEST_FP4(as::datetime,as::date_long  ,as::time_long  ,as::gmt,a_datetime,"February 5, 1970" PERIOD " 3:33:13 PM GMT+00:00",time_t,a_datetime);
    TEST_FP4(as::datetime,as::date_full  ,as::time_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970" PERIOD " 3:33:13 PM GMT+00:00",time_t,a_datetime);
    #endif

    time_t now=time(0);
    time_t lnow = now + 3600 * 4;
    char local_time_str[256];
    std::string format="%H:%M:%S";
    std::basic_string<CharType> format_string(format.begin(),format.end());
    strftime(local_time_str,sizeof(local_time_str),format.c_str(),gmtime(&lnow));
    TEST_FMT(as::ftime(format_string),now,local_time_str);
    TEST_FMT(as::ftime(format_string)<<as::gmt<<as::local_time,now,local_time_str);

    std::string marks =  
        "aAbB" 
        "cdeh"
        "HIjm"
        "Mnpr"
        "RStT"
        "xXyY"
        "Z%";

    std::string result[]= { 
        "Thu","Thursday","Feb","February",  // aAbB
        #if BOOSTER_ICU_VER >= 408
        "Thursday, February 5, 1970" ICUAT  " 3:33:13 PM " GMT_FULL, // c
        #else
        "Thursday, February 5, 1970 3:33:13 PM GMT+00:00", // c
        #endif
        "05","5","Feb", // deh
        "15","03","36","02", // HIjm
        "33","\n","PM", "03:33:13 PM",// Mnpr
        "15:33","13","\t","15:33:13", // RStT
        "Feb 5, 1970","3:33:13 PM","70","1970", // xXyY
        #if BOOSTER_ICU_VER >= 408
        GMT_FULL // Z
        #else
        "GMT+00:00" // Z
        #endif
        ,"%" }; // %

    for(unsigned i=0;i<marks.size();i++) {
        format_string.clear();
        format_string+=static_cast<CharType>('%');
        format_string+=static_cast<CharType>(marks[i]);
        TEST_FMT(as::ftime(format_string)<<as::gmt,a_datetime,result[i]);
    }

    std::string sample_f[]={
        "Now is %A, %H o'clo''ck ' or not ' ",
        "'test %H'",
        "%H'",
        "'%H'" 
    };
    std::string expected_f[] = {
        "Now is Thursday, 15 o'clo''ck ' or not ' ",
        "'test 15'",
        "15'",
        "'15'"
    };

    for(unsigned i=0;i<sizeof(sample_f)/sizeof(sample_f[0]);i++) {
        format_string.assign(sample_f[i].begin(),sample_f[i].end());
        TEST_FMT(as::ftime(format_string)<<as::gmt,a_datetime,expected_f[i]);
    }

}